

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

int Cut_ManMappingArea_rec(Cut_Man_t *p,int Node)

{
  Vec_Ptr_t *pVVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  pVVar1 = p->vCutsMax;
  iVar4 = 0;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if ((Node < 0) || (pVVar1->nSize <= Node)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puVar2 = (uint *)pVVar1->pArray[(uint)Node];
    iVar4 = 0;
    if ((puVar2 != (uint *)0x0) && ((*puVar2 & 0xf0000000) != 0x10000000)) {
      iVar4 = 1;
      if (0xfffffff < *puVar2) {
        uVar5 = 0;
        iVar4 = 0;
        do {
          iVar3 = Cut_ManMappingArea_rec(p,puVar2[uVar5 + 6]);
          iVar4 = iVar4 + iVar3;
          uVar5 = uVar5 + 1;
        } while (uVar5 < *puVar2 >> 0x1c);
        iVar4 = iVar4 + 1;
      }
      if (p->vCutsMax->nSize <= Node) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      p->vCutsMax->pArray[(uint)Node] = (void *)0x0;
    }
  }
  return iVar4;
}

Assistant:

int Cut_ManMappingArea_rec( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pCut;
    int i, Counter;
    if ( p->vCutsMax == NULL )
        return 0;
    pCut = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsMax, Node );
    if ( pCut == NULL || pCut->nLeaves == 1 )
        return 0;
    Counter = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        Counter += Cut_ManMappingArea_rec( p, pCut->pLeaves[i] );
    Vec_PtrWriteEntry( p->vCutsMax, Node, NULL );
    return 1 + Counter;
}